

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.cpp
# Opt level: O3

StartResult __thiscall
chatter::Host::start(Host *this,HostAddress *bind_address,uint16_t max_connections)

{
  vector<chatter::Peer,_std::allocator<chatter::Peer>_> *this_00;
  bool bVar1;
  uint16_t uVar2;
  StartResult SVar3;
  ostream *poVar4;
  rep rVar5;
  thread *ptVar6;
  uint uVar7;
  long lVar8;
  Peer p;
  Host *local_498;
  Peer local_490;
  
  SVar3 = ALREADY_RUNNING;
  if (this->m_run_threads == false) {
    bVar1 = create_socket(this);
    SVar3 = SOCKET_CREATE_FAILED;
    if (bVar1) {
      bVar1 = platform::SocketBind(this->m_socket,bind_address);
      SVar3 = SOCKET_BIND_FAILED;
      if (bVar1) {
        uVar2 = 1;
        if (1 < max_connections) {
          uVar2 = max_connections;
        }
        this->m_max_connections = uVar2;
        this_00 = &this->m_peers;
        std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>::clear(this_00);
        std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>::reserve
                  (this_00,(ulong)this->m_max_connections);
        if (this->m_max_connections != 0) {
          uVar7 = 0;
          do {
            Peer::Peer(&local_490);
            local_490.m_id = uVar7;
            std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>::push_back
                      (this_00,&local_490);
            lVar8 = 0x450;
            do {
              std::__cxx11::
              _List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
              ::_M_clear((_List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
                          *)((long)local_490.m_channels + lVar8 + -0x48));
              lVar8 = lVar8 + -0x20;
            } while (lVar8 != 0x30);
            uVar7 = uVar7 + 1;
          } while (uVar7 < this->m_max_connections);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"m_peers allocated: size:",0x18);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," cap:",5);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        rVar5 = std::chrono::_V2::system_clock::now();
        (this->m_start_time).__d.__r = rVar5;
        this->m_run_threads = true;
        ptVar6 = (thread *)operator_new(8);
        local_490._0_8_ = net_worker;
        local_490.m_address.m_address = 0;
        local_490.m_address.m_port = 0;
        local_490.m_address._6_2_ = 0;
        local_498 = this;
        std::thread::thread<void(chatter::Host::*)(),chatter::Host*,void>
                  (ptVar6,(offset_in_Host_to_subr *)&local_490,&local_498);
        std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
                  ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)
                   &this->m_net_worker,ptVar6);
        std::thread::detach();
        ptVar6 = (thread *)operator_new(8);
        local_490._0_8_ = recv_worker;
        local_490.m_address.m_address = 0;
        local_490.m_address.m_port = 0;
        local_490.m_address._6_2_ = 0;
        local_498 = this;
        std::thread::thread<void(chatter::Host::*)(),chatter::Host*,void>
                  (ptVar6,(offset_in_Host_to_subr *)&local_490,&local_498);
        std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
                  ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)
                   &this->m_recv_worker,ptVar6);
        std::thread::detach();
        SVar3 = START_OK;
      }
    }
  }
  return SVar3;
}

Assistant:

Host::StartResult Host::start(const HostAddress& bind_address, uint16_t max_connections)
{
    if (m_run_threads)
        return ALREADY_RUNNING;

    if (!create_socket())
        return SOCKET_CREATE_FAILED;

    if (!platform::SocketBind(m_socket, bind_address))
        return SOCKET_BIND_FAILED;

    m_max_connections = max_connections > 0 ? max_connections : 1;

    m_peers.clear();
    m_peers.reserve(m_max_connections);
    for (int peer_id = 0; peer_id < m_max_connections; ++peer_id) {
        Peer p;
        p.m_id = peer_id;
        m_peers.push_back(p);
    }

    std::cout << "m_peers allocated: size:" << m_peers.size() << " cap:" << m_peers.capacity() << std::endl;

    m_start_time = std::chrono::high_resolution_clock::now();

    m_run_threads = true;
    m_net_worker.reset(new std::thread(&Host::net_worker, this));
    m_net_worker->detach();
    m_recv_worker.reset(new std::thread(&Host::recv_worker, this));
    m_recv_worker->detach();

    return START_OK;
}